

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O1

void Bdc_ManDecPrint_rec(Bdc_Man_t *p,Bdc_Fun_t *pNode)

{
  Bdc_Fun_t *pBVar1;
  Bdc_Fun_t *pBVar2;
  int __c;
  
  if (pNode->Type == 3) {
    pBVar1 = pNode->pFan0;
    pBVar2 = pNode->pFan1;
    if (((ulong)pBVar1 & 1) != 0) {
      putchar(0x21);
      if (*(int *)((ulong)pBVar1 & 0xfffffffffffffffe) != 2) {
        putchar(0x28);
      }
    }
    Bdc_ManDecPrint_rec(p,(Bdc_Fun_t *)((ulong)pBVar1 & 0xfffffffffffffffe));
    if ((((ulong)pBVar1 & 1) != 0) &&
       (((Bdc_Fun_t *)((ulong)pBVar1 & 0xfffffffffffffffe))->Type != 2)) {
      putchar(0x29);
    }
    if (((ulong)pBVar2 & 1) != 0) {
      putchar(0x21);
      if (*(int *)((ulong)pBVar2 & 0xfffffffffffffffe) != 2) {
        putchar(0x28);
      }
    }
    Bdc_ManDecPrint_rec(p,(Bdc_Fun_t *)((ulong)pBVar2 & 0xfffffffffffffffe));
    if ((((ulong)pBVar2 & 1) == 0) ||
       (__c = 0x29, ((Bdc_Fun_t *)((ulong)pBVar2 & 0xfffffffffffffffe))->Type == 2)) {
      return;
    }
  }
  else {
    if (pNode->Type != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcCore.c"
                    ,0x102,"void Bdc_ManDecPrint_rec(Bdc_Man_t *, Bdc_Fun_t *)");
    }
    __c = (int)((ulong)((long)pNode - (long)p->pNodes) >> 3) * -0x49249249 + 0x60;
  }
  putchar(__c);
  return;
}

Assistant:

void Bdc_ManDecPrint_rec( Bdc_Man_t * p, Bdc_Fun_t * pNode )
{
    if ( pNode->Type == BDC_TYPE_PI )
        printf( "%c", 'a' + Bdc_FunId(p,pNode) - 1 );
    else if ( pNode->Type == BDC_TYPE_AND )
    {
        Bdc_Fun_t * pNode0 = Bdc_FuncFanin0( pNode );
        Bdc_Fun_t * pNode1 = Bdc_FuncFanin1( pNode );

        if ( Bdc_IsComplement(pNode0) )
            printf( "!" );
        if ( Bdc_IsComplement(pNode0) && Bdc_Regular(pNode0)->Type != BDC_TYPE_PI )
            printf( "(" );
        Bdc_ManDecPrint_rec( p, Bdc_Regular(pNode0) );
        if ( Bdc_IsComplement(pNode0) && Bdc_Regular(pNode0)->Type != BDC_TYPE_PI )
            printf( ")" );

        if ( Bdc_IsComplement(pNode1) )
            printf( "!" );
        if ( Bdc_IsComplement(pNode1) && Bdc_Regular(pNode1)->Type != BDC_TYPE_PI )
            printf( "(" );
        Bdc_ManDecPrint_rec( p, Bdc_Regular(pNode1) );
        if ( Bdc_IsComplement(pNode1) && Bdc_Regular(pNode1)->Type != BDC_TYPE_PI )
            printf( ")" );
    }
    else assert( 0 );
}